

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O2

bool __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::canInsert
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,
          gate_type *gate)

{
  int iVar1;
  int iVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  vector<int,_std::allocator<int>_> qubits;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  (*gate->_vptr_QObject[5])(&local_28);
  _Var3 = std::
          __max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_28._M_impl.super__Vector_impl_data._M_start,
                     local_28._M_impl.super__Vector_impl_data._M_finish);
  iVar2 = *_Var3._M_current;
  iVar1 = this->nbQubits_;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return iVar2 < iVar1;
}

Assistant:

bool canInsert( const gate_type& gate ) const {
        const auto qubits = gate.qubits() ;
        if ( *std::max_element( qubits.begin() , qubits.end() ) >= nbQubits_ ) {
          return false ;
        }
        return true ;
      }